

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  thread talker;
  thread responder;
  thread local_20;
  thread local_18;
  function_type *local_10;
  
  local_20._M_id._M_thread = (id)responsive_thread;
  std::thread::thread<void(*)(),,void>(&local_18,(function_type **)&local_20);
  local_20._M_id._M_thread = (id)500;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)&local_20);
  local_10 = talkative_thread;
  std::thread::thread<void(*)(),,void>(&local_20,&local_10);
  std::thread::join();
  std::thread::join();
  std::thread::~thread(&local_20);
  std::thread::~thread(&local_18);
  return 0;
}

Assistant:

int
main()
{
  std::thread responder(&responsive_thread);
  std::this_thread::sleep_for(500ms);
  std::thread talker(&talkative_thread);
  responder.join();
  talker.join();
}